

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashedSimplePairCache.cpp
# Opt level: O2

void __thiscall cbtHashedSimplePairCache::removeAllPairs(cbtHashedSimplePairCache *this)

{
  cbtAlignedObjectArray<cbtSimplePair>::clear(&this->m_overlappingPairArray);
  cbtAlignedObjectArray<int>::clear(&this->m_hashTable);
  cbtAlignedObjectArray<int>::clear(&this->m_next);
  cbtAlignedObjectArray<cbtSimplePair>::reserve(&this->m_overlappingPairArray,2);
  growTables(this);
  return;
}

Assistant:

void cbtHashedSimplePairCache::removeAllPairs()
{
	m_overlappingPairArray.clear();
	m_hashTable.clear();
	m_next.clear();

	int initialAllocatedSize = 2;
	m_overlappingPairArray.reserve(initialAllocatedSize);
	growTables();
}